

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::CopyVertex
          (ColladaParser *this,size_t currentVertex,size_t numOffsets,size_t numPoints,
          size_t perVertexOffset,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t currentPrimitive,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *indices)

{
  iterator iVar1;
  bool bVar2;
  ulong uVar3;
  size_type sVar4;
  reference pIVar5;
  pointer pIVar6;
  const_reference pvVar7;
  __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
  local_60;
  __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
  local_58;
  iterator it_1;
  __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
  local_48;
  iterator it;
  size_t baseOffset;
  Mesh *pMesh_local;
  size_t perVertexOffset_local;
  size_t numPoints_local;
  size_t numOffsets_local;
  size_t currentVertex_local;
  ColladaParser *this_local;
  
  it._M_current =
       (InputChannel *)(currentPrimitive * numOffsets * numPoints + currentVertex * numOffsets);
  uVar3 = (long)it._M_current + (numOffsets - 1);
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(indices);
  if (uVar3 < sVar4) {
    local_48._M_current =
         (InputChannel *)
         std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
         ::begin(&pMesh->mPerVertexData);
    while( true ) {
      it_1 = std::
             vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
             end(&pMesh->mPerVertexData);
      bVar2 = __gnu_cxx::operator!=(&local_48,&it_1);
      if (!bVar2) break;
      pIVar5 = __gnu_cxx::
               __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
               ::operator*(&local_48);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (indices,(long)&(it._M_current)->mType + perVertexOffset);
      ExtractDataObjectFromChannel(this,pIVar5,*pvVar7,pMesh);
      __gnu_cxx::
      __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
      ::operator++(&local_48);
    }
    local_58._M_current =
         (InputChannel *)
         std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
         ::begin(pPerIndexChannels);
    while( true ) {
      local_60._M_current =
           (InputChannel *)
           std::
           vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>::
           end(pPerIndexChannels);
      bVar2 = __gnu_cxx::operator!=(&local_58,&local_60);
      if (!bVar2) break;
      pIVar5 = __gnu_cxx::
               __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
               ::operator*(&local_58);
      iVar1 = it;
      pIVar6 = __gnu_cxx::
               __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
               ::operator->(&local_58);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (indices,(long)&(iVar1._M_current)->mType + pIVar6->mOffset);
      ExtractDataObjectFromChannel(this,pIVar5,*pvVar7,pMesh);
      __gnu_cxx::
      __normal_iterator<Assimp::Collada::InputChannel_*,_std::vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>_>
      ::operator++(&local_58);
    }
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (indices,(long)&(it._M_current)->mType + perVertexOffset);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&pMesh->mFacePosIndices,pvVar7);
    return;
  }
  __assert_fail("(baseOffset + numOffsets - 1) < indices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.cpp"
                ,0xaaa,
                "void Assimp::ColladaParser::CopyVertex(size_t, size_t, size_t, size_t, Mesh *, std::vector<InputChannel> &, size_t, const std::vector<size_t> &)"
               );
}

Assistant:

void ColladaParser::CopyVertex(size_t currentVertex, size_t numOffsets, size_t numPoints, size_t perVertexOffset, Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels, size_t currentPrimitive, const std::vector<size_t>& indices) {
    // calculate the base offset of the vertex whose attributes we ant to copy
    size_t baseOffset = currentPrimitive * numOffsets * numPoints + currentVertex * numOffsets;

    // don't overrun the boundaries of the index list
    ai_assert((baseOffset + numOffsets - 1) < indices.size());

    // extract per-vertex channels using the global per-vertex offset
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
        ExtractDataObjectFromChannel(*it, indices[baseOffset + perVertexOffset], pMesh);
    // and extract per-index channels using there specified offset
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
        ExtractDataObjectFromChannel(*it, indices[baseOffset + it->mOffset], pMesh);

    // store the vertex-data index for later assignment of bone vertex weights
    pMesh->mFacePosIndices.push_back(indices[baseOffset + perVertexOffset]);
}